

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O1

LY_ERR json_print_node(jsonpr_ctx *pctx,lyd_node *node)

{
  ushort uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  lyd_node *plVar7;
  lyd_node *plVar8;
  lysc_node *plVar9;
  ly_bool lVar10;
  byte bVar11;
  LY_ERR LVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  lyd_node_opaq *onode2_1;
  uint32_t *opts;
  lys_module *plVar16;
  lyd_node_opaq *onode2;
  ulong uVar17;
  char *pcVar18;
  lyd_node_opaq *onode1_1;
  lyd_node_inner *parent;
  ly_out *out;
  char *pcVar19;
  lyd_node_opaq *onode2_2;
  lyd_node_opaq *node_00;
  lyd_node_opaq *onode1;
  lyd_node_opaq *node1;
  lyd_node_opaq *plVar20;
  lyd_meta *plVar21;
  char *pcVar22;
  bool bVar23;
  lyd_node *local_50;
  lys_module *local_48;
  uint32_t local_3c;
  lys_module *local_38;
  
  lVar10 = lyd_node_should_print(node,pctx->options);
  if (lVar10 == '\0') {
    lVar10 = json_print_array_is_last_inst(pctx,node);
    if (lVar10 == '\0') {
      return LY_SUCCESS;
    }
    json_print_array_close(pctx);
    return LY_SUCCESS;
  }
  if (node->schema == (lysc_node *)0x0) {
    uVar13 = 0;
    uVar15 = *(uint *)&node[1].meta;
    if (*(uint *)&node[1].meta == 0x3f3) {
      uVar15 = uVar13;
    }
    if ((uVar15 & 0x180) == 0) {
      bVar11 = 1;
    }
    else {
      if (node->prev->next == (lyd_node *)0x0) {
        bVar11 = 1;
      }
      else {
        iVar14 = matching_node(node->prev,node);
        bVar11 = (byte)iVar14 ^ 1;
      }
      plVar7 = node->next;
      if (((node == (lyd_node *)0x0 || plVar7 == (lyd_node *)0x0) ||
          (node->schema != plVar7->schema)) ||
         ((node->schema == (lysc_node *)0x0 &&
          ((node[1].schema != plVar7[1].schema || (node[1].parent != plVar7[1].parent)))))) {
        uVar13 = 0;
      }
      else {
        uVar13 = 1;
      }
    }
    if (bVar11 == 0) {
      if ((uVar15 >> 8 & 1) != 0) {
        uVar17 = 0;
        pcVar19 = "";
        if ((pctx->options & 2) == 0) {
          pcVar19 = "\n";
          uVar17 = (ulong)((uint)pctx->level * 2);
        }
        ly_print_(pctx->out,",%s%*s",pcVar19,uVar17,"");
      }
    }
    else {
      LVar12 = json_print_member2(pctx,pctx->parent,*(LY_VALUE_FORMAT *)((long)&node[1].meta + 4),
                                  (ly_opaq_name *)&node[1].schema,'\0');
      if ((LVar12 != LY_SUCCESS) ||
         (((uVar15 & 0x180) != 0 &&
          (LVar12 = json_print_array_open(pctx,node), LVar12 != LY_SUCCESS))))
      goto joined_r0x0013d974;
      if ((uVar15 >> 8 & 1) != 0) {
        uVar17 = 0;
        if ((pctx->options & 2) == 0) {
          uVar17 = (ulong)((uint)pctx->level * 2);
        }
        ly_print_(pctx->out,"%*s",uVar17,"");
      }
    }
    if (((uVar15 & 0x280) == 0) &&
       (lVar4._0_4_ = node[1].hash, lVar4._4_4_ = node[1].flags, lVar4 == 0)) {
      if ((uVar15 & 0x40) == 0) {
        if ((char)((uVar15 & 0x10) >> 4) == '\0' && (uVar15 & 0x22) != 0) {
          ly_print_(pctx->out,"%s");
        }
        else {
          json_print_string(pctx->out,(char *)node[1].prev);
        }
      }
      else {
        ly_print_(pctx->out,"[null]");
      }
      pctx->level_printed = pctx->level;
      if ((uVar15 >> 8 & 1) == 0) {
        json_print_attributes(pctx,node,'\0');
      }
      else if ((pctx->first_leaflist == (lyd_node *)0x0) &&
              (lVar5._0_4_ = node[2].hash, lVar5._4_4_ = node[2].flags, lVar5 != 0)) {
        pctx->first_leaflist = node;
      }
    }
    else {
      LVar12 = json_print_inner(pctx,node);
      if (LVar12 != LY_SUCCESS) goto joined_r0x0013d974;
      pctx->level_printed = pctx->level;
    }
    LVar12 = LY_SUCCESS;
    if ((uVar15 & 0x180) != 0 && (char)uVar13 == '\0') {
      json_print_array_close(pctx);
      pctx->level_printed = pctx->level;
    }
    goto joined_r0x0013d974;
  }
  uVar1 = node->schema->nodetype;
  if (uVar1 < 0x20) {
    if (uVar1 < 8) {
      if (uVar1 == 1) goto LAB_0013d958;
      if (uVar1 != 4) goto LAB_0013dcda;
      json_print_member(pctx,node,'\0');
      plVar9 = node->schema;
      if (plVar9 == (lysc_node *)0x0) {
        plVar16 = (lys_module *)&node[2].schema;
      }
      else {
        plVar16 = plVar9->module;
      }
      LVar12 = json_print_value(pctx,plVar16->ctx,(lyd_value *)(node + 1),plVar9->module);
      if (LVar12 != LY_SUCCESS) goto joined_r0x0013d974;
LAB_0013df55:
      pctx->level_printed = pctx->level;
      json_print_attributes(pctx,node,'\0');
      LVar12 = LY_SUCCESS;
    }
    else {
      if ((uVar1 != 8) && (uVar1 != 0x10)) goto LAB_0013dcda;
      uVar3 = (pctx->open).count;
      if ((uVar3 == 0) ||
         (iVar14 = matching_node(node,(pctx->open).field_2.dnodes[uVar3 - 1]), iVar14 == 0)) {
        json_print_member(pctx,node,'\0');
        LVar12 = json_print_array_open(pctx,node);
        if (LVar12 != LY_SUCCESS) goto joined_r0x0013d974;
        if (node->schema->nodetype == 8) {
          uVar17 = 0;
          if ((pctx->options & 2) == 0) {
            uVar17 = (ulong)((uint)pctx->level * 2);
          }
          ly_print_(pctx->out,"%*s",uVar17,"");
        }
      }
      else if (node->schema->nodetype == 8) {
        uVar17 = 0;
        pcVar19 = "";
        if ((pctx->options & 2) == 0) {
          pcVar19 = "\n";
          uVar17 = (ulong)((uint)pctx->level * 2);
        }
        ly_print_(pctx->out,",%s%*s",pcVar19,uVar17,"");
      }
      uVar2 = node->schema->nodetype;
      if (uVar2 == 8) {
        plVar16 = node->schema->module;
        LVar12 = json_print_value(pctx,plVar16->ctx,(lyd_value *)(node + 1),plVar16);
        if (LVar12 == LY_SUCCESS) {
          if (pctx->first_leaflist == (lyd_node *)0x0) {
            if ((((node->flags & 1) != 0) && ((pctx->options & 0xc0) != 0)) ||
               (((pctx->options & 0x40) != 0 && (lVar10 = lyd_is_default(node), lVar10 != '\0')))) {
              if (node->schema == (lysc_node *)0x0) {
                plVar16 = (lys_module *)&node[2].schema;
              }
              else {
                plVar16 = node->schema->module;
              }
              plVar16 = ly_ctx_get_module_implemented(plVar16->ctx,"ietf-netconf-with-defaults");
              if (plVar16 != (lys_module *)0x0) {
LAB_0013df92:
                pctx->first_leaflist = node;
                goto LAB_0013df96;
              }
            }
            for (plVar21 = node->meta; plVar21 != (lyd_meta *)0x0; plVar21 = plVar21->next) {
              lVar10 = lyd_metadata_should_print(plVar21);
              if (lVar10 != '\0') goto LAB_0013df92;
            }
          }
LAB_0013df96:
          lVar10 = json_print_array_is_last_inst(pctx,node);
          LVar12 = LY_SUCCESS;
          if (lVar10 != '\0') {
            json_print_array_close(pctx);
            LVar12 = LY_SUCCESS;
          }
        }
      }
      else {
        if (uVar2 != 0x10) {
          __assert_fail("node->schema->nodetype == LYS_LEAFLIST",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
                        ,0x332,
                        "LY_ERR json_print_leaf_list(struct jsonpr_ctx *, const struct lyd_node *)")
          ;
        }
        LVar12 = json_print_inner(pctx,node);
        if (LVar12 == LY_SUCCESS) goto LAB_0013df96;
      }
    }
  }
  else {
    if (0xff < uVar1) {
      if (((uVar1 != 0x100) && (uVar1 != 0x400)) && (uVar1 != 0x200)) {
LAB_0013dcda:
        ly_log(pctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
               ,0x3fe);
        return LY_EMEM;
      }
LAB_0013d958:
      json_print_member(pctx,node,'\0');
      LVar12 = json_print_inner(pctx,node);
      goto joined_r0x0013d974;
    }
    if ((uVar1 != 0x20) && (uVar1 != 0x60)) goto LAB_0013dcda;
    json_print_member(pctx,node,'\0');
    local_3c = 0;
    uVar1 = node->schema->nodetype;
    if ((uVar1 & 0x60) == 0) {
      __assert_fail("any->schema->nodetype & LYD_NODE_ANY",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
                    ,0x244,
                    "LY_ERR json_print_any_content(struct jsonpr_ctx *, struct lyd_node_any *)");
    }
    if ((uVar1 == 0x60) && (*(int *)&node[1].schema != 0)) {
      ly_log(pctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
             ,0x247);
      LVar12 = LY_EINT;
    }
    else {
      if (*(int *)&node[1].schema == 4) {
        opts = ly_temp_log_options(&local_3c);
        LVar12 = lyd_parse_data_mem(pctx->ctx,*(char **)(node + 1),LYD_LYB,0x70000,0,&local_50);
        if (LVar12 == LY_SUCCESS) {
          free(*(void **)(node + 1));
          *(lyd_node **)(node + 1) = local_50;
          *(undefined4 *)&node[1].schema = 0;
        }
        ly_temp_log_options(opts);
      }
      LVar12 = LY_SUCCESS;
      switch(*(undefined4 *)&node[1].schema) {
      case 0:
        pcVar19 = "";
        if ((pctx->options & 2) == 0) {
          pcVar19 = "\n";
        }
        ly_print_(pctx->out,"{%s",pcVar19);
        pctx->level = pctx->level + 1;
        plVar7 = pctx->parent;
        uVar15 = pctx->options;
        pctx->parent = node;
        pctx->options = uVar15 & 0xfffffffe;
        for (local_50 = *(lyd_node **)(node + 1); local_50 != (lyd_node *)0x0;
            local_50 = local_50->next) {
          LVar12 = json_print_node(pctx,local_50);
          if (LVar12 != LY_SUCCESS) {
            pctx->level = pctx->level - 1;
            goto switchD_0013dc3c_default;
          }
        }
        pctx->parent = plVar7;
        pctx->options = uVar15;
        uVar13 = *(int *)&pctx->level - 1;
        pctx->level = (uint16_t)uVar13;
        out = pctx->out;
        if ((uVar15 & 2) == 0) {
          LVar12 = LY_SUCCESS;
          ly_print_(out,"\n%*s}",(ulong)((uVar13 & 0xffff) * 2),"");
        }
        else {
          pcVar19 = "}";
LAB_0013df48:
          ly_print_(out,pcVar19);
          LVar12 = LY_SUCCESS;
        }
        break;
      case 1:
      case 2:
        if (*(char **)(node + 1) == (char *)0x0) {
LAB_0013deea:
          out = pctx->out;
          if (node->schema->nodetype == 0x20) {
            pcVar19 = "null";
          }
          else {
            pcVar19 = "{}";
          }
          goto LAB_0013df48;
        }
        json_print_string(pctx->out,*(char **)(node + 1));
        LVar12 = LY_SUCCESS;
        break;
      case 3:
        lVar6._0_4_ = node[1].hash;
        lVar6._4_4_ = node[1].flags;
        if (lVar6 == 0) goto LAB_0013deea;
        ly_print_(pctx->out,"%s");
        LVar12 = LY_SUCCESS;
        break;
      case 4:
        ly_log(pctx->ctx,LY_LLWRN,LY_SUCCESS,"Unable to print anydata content (type %d) as JSON.",4)
        ;
        LVar12 = LY_SUCCESS;
      }
    }
switchD_0013dc3c_default:
    if (LVar12 == LY_SUCCESS) goto LAB_0013df55;
  }
joined_r0x0013d974:
  if (LVar12 != LY_SUCCESS) {
    return LVar12;
  }
  pctx->level_printed = pctx->level;
  plVar7 = pctx->first_leaflist;
  if (plVar7 == (lyd_node *)0x0) {
    return LY_SUCCESS;
  }
  plVar8 = node->next;
  if ((plVar8 != (lyd_node *)0x0) && (plVar8->schema == plVar7->schema)) {
    if (plVar8->schema != (lysc_node *)0x0) {
      return LY_SUCCESS;
    }
    if ((plVar8[1].schema == plVar7[1].schema) && (plVar8[1].parent == plVar7[1].parent)) {
      return LY_SUCCESS;
    }
  }
  if ((pctx->options & 0xc0) == 0) {
    local_48 = (lys_module *)0x0;
  }
  else {
    local_48 = ly_ctx_get_module_implemented(pctx->ctx,"ietf-netconf-with-defaults");
  }
  plVar20 = (lyd_node_opaq *)pctx->first_leaflist;
  do {
    node1 = plVar20;
    plVar20 = (lyd_node_opaq *)(node1->field_0).node.prev;
    if ((plVar20->field_0).node.next == (lyd_node *)0x0) break;
    iVar14 = matching_node((lyd_node *)node1,(lyd_node *)plVar20);
  } while (iVar14 != 0);
  if ((node1->field_0).node.schema == (lysc_node *)0x0) {
    if (node1 == (lyd_node_opaq *)0x0) {
      parent = (lyd_node_inner *)0x0;
    }
    else {
      parent = (node1->field_0).node.parent;
    }
    LVar12 = json_print_member2(pctx,(lyd_node *)parent,node1->format,&node1->name,'\x01');
    plVar20 = node1;
    if (LVar12 != LY_SUCCESS) goto LAB_0013e2b6;
  }
  else {
    json_print_member(pctx,(lyd_node *)node1,'\x01');
    plVar20 = (lyd_node_opaq *)0x0;
  }
  pcVar19 = "\n";
  pcVar22 = "";
  pcVar18 = "";
  if ((pctx->options & 2) == 0) {
    pcVar18 = "\n";
  }
  ly_print_(pctx->out,"[%s",pcVar18);
  pctx->level = pctx->level + 1;
  if (node1 != (lyd_node_opaq *)0x0) {
    do {
      node_00 = node1;
      if (pctx->level <= pctx->level_printed) {
        pcVar18 = pcVar22;
        if ((pctx->options & 2) == 0) {
          pcVar18 = pcVar19;
        }
        ly_print_(pctx->out,",%s",pcVar18);
      }
      if (((node_00->field_0).node.schema == (lysc_node *)0x0) ||
         ((plVar16 = local_48,
          (undefined1  [56])((undefined1  [56])node_00->field_0 & (undefined1  [56])0x100000000) ==
          (undefined1  [56])0x0 &&
          (((pctx->options & 0x40) == 0 ||
           (lVar10 = lyd_is_default((lyd_node *)node_00), plVar16 = local_48, lVar10 == '\0')))))) {
        plVar16 = (lys_module *)0x0;
      }
      if ((node_00->field_0).node.schema == (lysc_node *)0x0) {
LAB_0013e128:
        if ((plVar20 != (lyd_node_opaq *)0x0) && (plVar20->attr != (lyd_attr *)0x0))
        goto LAB_0013e134;
        uVar17 = 0;
        if ((pctx->options & 2) == 0) {
          uVar17 = (ulong)((uint)pctx->level * 2);
        }
        ly_print_(pctx->out,"%*snull",uVar17,"");
      }
      else {
        local_38 = plVar16;
        for (plVar21 = (node_00->field_0).node.meta; plVar21 != (lyd_meta *)0x0;
            plVar21 = plVar21->next) {
          lVar10 = lyd_metadata_should_print(plVar21);
          bVar23 = lVar10 != '\0';
          if (bVar23) goto LAB_0013e10e;
        }
        bVar23 = false;
LAB_0013e10e:
        plVar16 = local_38;
        if ((!bVar23) && (local_38 == (lys_module *)0x0)) goto LAB_0013e128;
LAB_0013e134:
        uVar17 = 0;
        pcVar18 = "{";
        if ((pctx->options & 2) == 0) {
          uVar17 = (ulong)((uint)pctx->level * 2);
          pcVar18 = "{\n";
        }
        ly_print_(pctx->out,"%*s%s",uVar17,"",pcVar18);
        pctx->level = pctx->level + 1;
        if ((node_00->field_0).node.schema == (lysc_node *)0x0) {
          json_print_attribute(pctx,node_00);
        }
        else {
          LVar12 = json_print_metadata(pctx,(lyd_node *)node_00,plVar16);
          if (LVar12 != LY_SUCCESS) goto LAB_0013e2b6;
        }
        uVar15 = *(int *)&pctx->level - 1;
        pctx->level = (uint16_t)uVar15;
        bVar23 = (pctx->options & 2) == 0;
        pcVar18 = pcVar22;
        if (bVar23) {
          pcVar18 = pcVar19;
        }
        uVar15 = (uVar15 & 0xffff) * 2;
        if (!bVar23) {
          uVar15 = 0;
        }
        ly_print_(pctx->out,"%s%*s}",pcVar18,(ulong)uVar15,"");
      }
      pctx->level_printed = pctx->level;
      node1 = (lyd_node_opaq *)(node_00->field_0).node.next;
    } while (((node1 != (lyd_node_opaq *)0x0) &&
             (plVar9 = (node_00->field_0).node.schema, plVar9 == (node1->field_0).node.schema)) &&
            ((plVar9 != (lysc_node *)0x0 ||
             (((node_00->name).name == (node1->name).name &&
              ((node_00->name).prefix == (node1->name).prefix))))));
  }
  uVar15 = *(int *)&pctx->level - 1;
  pctx->level = (uint16_t)uVar15;
  bVar23 = (pctx->options & 2) != 0;
  if (bVar23) {
    pcVar19 = pcVar22;
  }
  uVar15 = (uVar15 & 0xffff) * 2;
  if (bVar23) {
    uVar15 = 0;
  }
  ly_print_(pctx->out,"%s%*s]",pcVar19,(ulong)uVar15,"");
  pctx->level_printed = pctx->level;
LAB_0013e2b6:
  pctx->first_leaflist = (lyd_node *)0x0;
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
json_print_node(struct jsonpr_ctx *pctx, const struct lyd_node *node)
{
    if (!lyd_node_should_print(node, pctx->options)) {
        if (json_print_array_is_last_inst(pctx, node)) {
            json_print_array_close(pctx);
        }
        return LY_SUCCESS;
    }

    if (!node->schema) {
        LY_CHECK_RET(json_print_opaq(pctx, (const struct lyd_node_opaq *)node));
    } else {
        switch (node->schema->nodetype) {
        case LYS_RPC:
        case LYS_ACTION:
        case LYS_NOTIF:
        case LYS_CONTAINER:
            LY_CHECK_RET(json_print_container(pctx, node));
            break;
        case LYS_LEAF:
            LY_CHECK_RET(json_print_leaf(pctx, node));
            break;
        case LYS_LEAFLIST:
        case LYS_LIST:
            LY_CHECK_RET(json_print_leaf_list(pctx, node));
            break;
        case LYS_ANYDATA:
        case LYS_ANYXML:
            LY_CHECK_RET(json_print_any(pctx, node));
            break;
        default:
            LOGINT(pctx->ctx);
            return EXIT_FAILURE;
        }
    }

    pctx->level_printed = pctx->level;

    if (pctx->first_leaflist && !matching_node(node->next, pctx->first_leaflist)) {
        json_print_meta_attr_leaflist(pctx);
        pctx->first_leaflist = NULL;
    }

    return LY_SUCCESS;
}